

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O0

void av1_dr_prediction_z2_sse4_1
               (uint8_t *dst,ptrdiff_t stride,int bw,int bh,uint8_t *above,uint8_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  int in_EDX;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  int in_stack_000001b4;
  uint8_t *in_stack_000001b8;
  undefined4 in_stack_000001c0;
  int in_stack_000001c4;
  uint8_t *in_stack_000001c8;
  uint8_t *in_stack_000001d0;
  undefined4 in_stack_000001d8;
  int in_stack_000001dc;
  uint8_t *in_stack_000001e0;
  int in_stack_000001e8;
  uint8_t *in_stack_00000350;
  uint8_t *in_stack_00000358;
  ptrdiff_t in_stack_00000360;
  uint8_t *in_stack_00000368;
  int in_stack_00000370;
  int in_stack_00000374;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc8;
  
  if (in_EDX == 4) {
    dr_prediction_z2_Nx4_sse4_1
              (in_stack_000001dc,in_stack_000001d0,(ptrdiff_t)in_stack_000001c8,
               (uint8_t *)CONCAT44(in_stack_000001c4,in_stack_000001c0),in_stack_000001b8,
               in_stack_000001b4,in_stack_00000018,in_stack_00000020,in_stack_ffffffffffffffc0);
  }
  else if (in_EDX == 8) {
    dr_prediction_z2_Nx8_sse4_1
              (in_stack_000001e8,in_stack_000001e0,CONCAT44(in_stack_000001dc,in_stack_000001d8),
               in_stack_000001d0,in_stack_000001c8,in_stack_000001c4,in_stack_00000018,
               in_stack_00000020,in_stack_ffffffffffffffc0);
  }
  else {
    dr_prediction_z2_HxW_sse4_1
              (in_stack_00000374,in_stack_00000370,in_stack_00000368,in_stack_00000360,
               in_stack_00000358,in_stack_00000350,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

void av1_dr_prediction_z2_sse4_1(uint8_t *dst, ptrdiff_t stride, int bw, int bh,
                                 const uint8_t *above, const uint8_t *left,
                                 int upsample_above, int upsample_left, int dx,
                                 int dy) {
  assert(dx > 0);
  assert(dy > 0);
  switch (bw) {
    case 4:
      dr_prediction_z2_Nx4_sse4_1(bh, dst, stride, above, left, upsample_above,
                                  upsample_left, dx, dy);
      break;
    case 8:
      dr_prediction_z2_Nx8_sse4_1(bh, dst, stride, above, left, upsample_above,
                                  upsample_left, dx, dy);
      break;
    default:
      dr_prediction_z2_HxW_sse4_1(bh, bw, dst, stride, above, left,
                                  upsample_above, upsample_left, dx, dy);
  }
  return;
}